

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_gen_keypair_base
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *G,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  ecp_curve_type eVar1;
  int iVar2;
  ulong buflen;
  size_t sVar3;
  bool bVar4;
  uchar local_a8 [8];
  uchar rnd [66];
  int local_5c;
  int count;
  size_t b;
  size_t n_size;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_mpi *d_local;
  mbedtls_ecp_point *G_local;
  mbedtls_ecp_group *grp_local;
  
  buflen = grp->nbits + 7 >> 3;
  eVar1 = ecp_get_type(grp);
  if (eVar1 == ECP_TYPE_MONTGOMERY) {
    do {
      n_size._4_4_ = mbedtls_mpi_fill_random(d,buflen,f_rng,p_rng);
      if (n_size._4_4_ != 0) goto LAB_0012b7d9;
      sVar3 = mbedtls_mpi_bitlen(d);
    } while (sVar3 == 0);
    sVar3 = mbedtls_mpi_bitlen(d);
    if (grp->nbits < sVar3 - 1) {
      n_size._4_4_ = mbedtls_mpi_shift_r(d,(sVar3 - 1) - grp->nbits);
    }
    else {
      n_size._4_4_ = mbedtls_mpi_set_bit(d,grp->nbits,'\x01');
    }
    if (((n_size._4_4_ == 0) && (n_size._4_4_ = mbedtls_mpi_set_bit(d,0,'\0'), n_size._4_4_ == 0))
       && (n_size._4_4_ = mbedtls_mpi_set_bit(d,1,'\0'), n_size._4_4_ == 0)) {
      n_size._4_4_ = mbedtls_mpi_set_bit(d,2,'\0');
    }
  }
  else {
    eVar1 = ecp_get_type(grp);
    if (eVar1 != ECP_TYPE_SHORT_WEIERSTRASS) {
      return -0x4f80;
    }
    local_5c = 0;
    do {
      n_size._4_4_ = (*f_rng)(p_rng,local_a8,buflen);
      if (((n_size._4_4_ != 0) ||
          (n_size._4_4_ = mbedtls_mpi_read_binary(d,local_a8,buflen), n_size._4_4_ != 0)) ||
         (n_size._4_4_ = mbedtls_mpi_shift_r(d,buflen * 8 - grp->nbits), n_size._4_4_ != 0)) break;
      local_5c = local_5c + 1;
      if (0x1e < local_5c) {
        return -0x4d00;
      }
      iVar2 = mbedtls_mpi_cmp_int(d,1);
      bVar4 = true;
      if (-1 < iVar2) {
        iVar2 = mbedtls_mpi_cmp_mpi(d,&grp->N);
        bVar4 = -1 < iVar2;
      }
    } while (bVar4);
  }
LAB_0012b7d9:
  if (n_size._4_4_ == 0) {
    grp_local._4_4_ = mbedtls_ecp_mul(grp,Q,d,G,f_rng,p_rng);
  }
  else {
    grp_local._4_4_ = n_size._4_4_;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_gen_keypair_base( mbedtls_ecp_group *grp,
                     const mbedtls_ecp_point *G,
                     mbedtls_mpi *d, mbedtls_ecp_point *Q,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    size_t n_size = ( grp->nbits + 7 ) / 8;

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* [M225] page 5 */
        size_t b;

        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
        } while( mbedtls_mpi_bitlen( d ) == 0);

        /* Make sure the most significant bit is nbits */
        b = mbedtls_mpi_bitlen( d ) - 1; /* mbedtls_mpi_bitlen is one-based */
        if( b > grp->nbits )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, b - grp->nbits ) );
        else
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, grp->nbits, 1 ) );

        /* Make sure the last three bits are unset */
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 0, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 1, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 2, 0 ) );
    }
    else
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* SEC1 3.2.1: Generate d such that 1 <= n < N */
        int count = 0;
        unsigned char rnd[MBEDTLS_ECP_MAX_BYTES];

        /*
         * Match the procedure given in RFC 6979 (deterministic ECDSA):
         * - use the same byte ordering;
         * - keep the leftmost nbits bits of the generated octet string;
         * - try until result is in the desired range.
         * This also avoids any biais, which is especially important for ECDSA.
         */
        do
        {
            MBEDTLS_MPI_CHK( f_rng( p_rng, rnd, n_size ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( d, rnd, n_size ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, 8 * n_size - grp->nbits ) );

            /*
             * Each try has at worst a probability 1/2 of failing (the msb has
             * a probability 1/2 of being 0, and then the result will be < N),
             * so after 30 tries failure probability is a most 2**(-30).
             *
             * For most curves, 1 try is enough with overwhelming probability,
             * since N starts with a lot of 1s in binary, but some curves
             * such as secp224k1 are actually very close to the worst case.
             */
            if( ++count > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 );
    }
    else
#endif /* ECP_SHORTWEIERSTRASS */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

cleanup:
    if( ret != 0 )
        return( ret );

    return( mbedtls_ecp_mul( grp, Q, d, G, f_rng, p_rng ) );
}